

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O2

void __thiscall slang::DiagnosticEngine::setDefaultWarnings(DiagnosticEngine *this)

{
  DiagGroup *group;
  undefined1 in_stack_00000028 [16];
  
  this->ignoreAllWarnings = true;
  group = findDefaultDiagGroup((string_view)in_stack_00000028);
  setSeverity(this,group,Warning);
  return;
}

Assistant:

void DiagnosticEngine::setDefaultWarnings() {
    setIgnoreAllWarnings(true);
    setSeverity(*findDiagGroup("default"sv), DiagnosticSeverity::Warning);
}